

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O2

void wr_randomizer(void)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  
  wr_u32b(Rand_value);
  wr_u32b(state_i);
  wr_u32b(z0);
  wr_u32b(z1);
  wr_u32b(z2);
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
    wr_u32b(STATE[lVar2]);
  }
  iVar1 = 0x1b;
  while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
    wr_u32b(0);
  }
  return;
}

Assistant:

void wr_randomizer(void)
{
	int i;

	/* current value for the simple RNG */
	wr_u32b(Rand_value);

	/* state index */
	wr_u32b(state_i);

	/* RNG variables */
	wr_u32b(z0);
	wr_u32b(z1);
	wr_u32b(z2);

	/* RNG state */
	for (i = 0; i < RAND_DEG; i++)
		wr_u32b(STATE[i]);

	/* NULL padding */
	for (i = 0; i < 59 - RAND_DEG; i++)
		wr_u32b(0);
}